

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# routines.c
# Opt level: O0

int routine_cmp(void *a,void *b)

{
  long *plVar1;
  long *plVar2;
  routine *bb;
  routine *aa;
  void *b_local;
  void *a_local;
  
  plVar1 = *a;
  plVar2 = *b;
  if (*plVar1 == *plVar2) {
    a_local._4_4_ = 0;
  }
  else if ((*(byte *)(plVar1 + 3) & 1) < (*(byte *)(plVar2 + 3) & 1)) {
    a_local._4_4_ = -1;
  }
  else if ((*(byte *)(plVar2 + 3) & 1) < (*(byte *)(plVar1 + 3) & 1)) {
    a_local._4_4_ = 1;
  }
  else {
    a_local._4_4_ = strcmp((char *)plVar1[1],(char *)plVar2[1]);
  }
  return a_local._4_4_;
}

Assistant:

static int
routine_cmp(const void *a, const void *b)
{
	const struct routine *aa = *(const struct routine **)a;
	const struct routine *bb = *(const struct routine **)b;
	if (aa->f == bb->f)
		return 0;
	if (aa->multicore < bb->multicore)
		return -1;
	if (aa->multicore > bb->multicore)
		return 1;
	return strcmp(aa->name, bb->name);
}